

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var cs::invoke<cs_impl::any>(var *func,any *_args)

{
  initializer_list<cs_impl::any> __l;
  initializer_list<cs_impl::any> __l_00;
  bool bVar1;
  runtime_error *this;
  proxy *in_RDI;
  vector args_1;
  object_method *om;
  vector args;
  string *in_stack_fffffffffffffe68;
  vector *in_stack_fffffffffffffe70;
  callable *in_stack_fffffffffffffe78;
  allocator *paVar2;
  type_info *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe98;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_fffffffffffffea0;
  iterator in_stack_fffffffffffffea8;
  size_type in_stack_fffffffffffffeb0;
  undefined8 ****local_140;
  any *in_stack_fffffffffffffef0;
  any *local_100;
  allocator local_d1;
  string local_d0 [40];
  undefined1 ****local_a8;
  undefined8 ***local_a0;
  undefined1 local_98 [8];
  undefined1 ****local_90;
  undefined8 local_88;
  object_method *local_68;
  any local_48;
  undefined1 *local_40;
  undefined8 local_38;
  
  cs_impl::any::type((any *)in_stack_fffffffffffffe70);
  bVar1 = std::type_info::operator==
                    (in_stack_fffffffffffffe80,(type_info *)in_stack_fffffffffffffe78);
  if (bVar1) {
    cs_impl::any::any((any *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_38 = 1;
    local_40 = (undefined1 *)&local_48;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x5d6c15);
    __l._M_len = in_stack_fffffffffffffeb0;
    __l._M_array = in_stack_fffffffffffffea8;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffea0,__l,in_stack_fffffffffffffe98);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x5d6c49);
    local_100 = (any *)&local_40;
    do {
      local_100 = local_100 + 0xffffffffffffffff;
      cs_impl::any::~any((any *)0x5d6c7e);
    } while (local_100 != &local_48);
    cs_impl::any::const_val<cs::callable>(local_100);
    callable::call(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe80);
  }
  else {
    cs_impl::any::type((any *)in_stack_fffffffffffffe70);
    bVar1 = std::type_info::operator==
                      (in_stack_fffffffffffffe80,(type_info *)in_stack_fffffffffffffe78);
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar2 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"Invoke non-callable object.",paVar2);
      runtime_error::runtime_error(this,in_stack_fffffffffffffe68);
      __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    local_68 = cs_impl::any::const_val<cs::object_method>(in_stack_fffffffffffffef0);
    local_a8 = (undefined1 ****)&local_a0;
    cs_impl::any::any((any *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_a8 = (undefined1 ****)local_98;
    cs_impl::any::any((any *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_90 = (undefined1 ****)&local_a0;
    local_88 = 2;
    std::allocator<cs_impl::any>::allocator((allocator<cs_impl::any> *)0x5d6e10);
    __l_00._M_len = in_stack_fffffffffffffeb0;
    __l_00._M_array = in_stack_fffffffffffffea8;
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
              (in_stack_fffffffffffffea0,__l_00,in_stack_fffffffffffffe98);
    std::allocator<cs_impl::any>::~allocator((allocator<cs_impl::any> *)0x5d6e41);
    local_140 = &local_90;
    do {
      local_140 = local_140 + -1;
      cs_impl::any::~any((any *)0x5d6e6a);
    } while (local_140 != &local_a0);
    cs_impl::any::const_val<cs::callable>(in_stack_fffffffffffffef0);
    callable::call(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::~vector
              ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_fffffffffffffe80);
  }
  return (var)in_RDI;
}

Assistant:

static var invoke(const var &func, ArgsT &&... _args)
	{
		if (func.type() == typeid(callable)) {
			vector args{std::forward<ArgsT>(_args)...};
			return func.const_val<callable>().call(args);
		}
		else if (func.type() == typeid(object_method)) {
			const auto &om = func.const_val<object_method>();
			vector args{om.object, std::forward<ArgsT>(_args)...};
			return om.callable.const_val<callable>().call(args);
		}
		else
			throw runtime_error("Invoke non-callable object.");
	}